

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

void __thiscall
cmConditionEvaluator::cmConditionEvaluator
          (cmConditionEvaluator *this,cmMakefile *makefile,cmListFileContext *context,
          cmListFileBacktrace *bt)

{
  PolicyStatus PVar1;
  
  this->Makefile = makefile;
  cmListFileContext::cmListFileContext(&this->ExecutionContext,context);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,bt);
  PVar1 = cmMakefile::GetPolicyStatus(makefile,CMP0012);
  this->Policy12Status = PVar1;
  PVar1 = cmMakefile::GetPolicyStatus(makefile,CMP0054);
  this->Policy54Status = PVar1;
  PVar1 = cmMakefile::GetPolicyStatus(makefile,CMP0057);
  this->Policy57Status = PVar1;
  PVar1 = cmMakefile::GetPolicyStatus(makefile,CMP0064);
  this->Policy64Status = PVar1;
  return;
}

Assistant:

cmConditionEvaluator::cmConditionEvaluator(cmMakefile& makefile,
                                           const cmListFileContext &context,
                                           const cmListFileBacktrace& bt):
  Makefile(makefile),
  ExecutionContext(context),
  Backtrace(bt),
  Policy12Status(makefile.GetPolicyStatus(cmPolicies::CMP0012)),
  Policy54Status(makefile.GetPolicyStatus(cmPolicies::CMP0054)),
  Policy57Status(makefile.GetPolicyStatus(cmPolicies::CMP0057)),
  Policy64Status(makefile.GetPolicyStatus(cmPolicies::CMP0064))
{

}